

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::DatePart::EpochMillisOperator::Inverse
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  reference input_00;
  undefined1 local_11;
  
  input_00 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  UnaryExecutor::
  ExecuteStandard<long,duckdb::timestamp_t,duckdb::UnaryLambdaWrapper,duckdb::DatePart::EpochMillisOperator::Inverse(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_>
            (input_00,result,input->count,&local_11,false,CAN_THROW_RUNTIME_ERROR);
  return;
}

Assistant:

static void Inverse(DataChunk &input, ExpressionState &state, Vector &result) {
			D_ASSERT(input.ColumnCount() == 1);

			UnaryExecutor::Execute<int64_t, timestamp_t>(input.data[0], result, input.size(), [&](int64_t input) {
				// millisecond amounts provided to epoch_ms should never be considered infinite
				// instead such values will just throw when converted to microseconds
				return Timestamp::FromEpochMsPossiblyInfinite(input);
			});
		}